

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalGenerator::GenerateRuleFile
          (string *__return_storage_ptr__,cmGlobalGenerator *this,string *output)

{
  int iVar1;
  undefined4 extraout_var;
  char *replace;
  
  cmStrCat<std::__cxx11::string_const&,char_const(&)[6]>
            (__return_storage_ptr__,output,(char (*) [6])".rule");
  iVar1 = (*this->_vptr_cmGlobalGenerator[0x17])(this);
  replace = (char *)CONCAT44(extraout_var,iVar1);
  if ((replace != (char *)0x0) && (*replace == '$')) {
    cmsys::SystemTools::ReplaceString(__return_storage_ptr__,replace,"/CMakeFiles");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::GenerateRuleFile(
  std::string const& output) const
{
  std::string ruleFile = cmStrCat(output, ".rule");
  const char* dir = this->GetCMakeCFGIntDir();
  if (dir && dir[0] == '$') {
    cmSystemTools::ReplaceString(ruleFile, dir, "/CMakeFiles");
  }
  return ruleFile;
}